

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O1

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::add(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
      *this,Node *node,size_t depth,Box<float> *box,Node **value)

{
  float *pfVar1;
  unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  uVar2;
  default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
  *this_00;
  Node **ppNVar3;
  Node *pNVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  Node ***pppNVar8;
  vector<Node*,std::allocator<Node*>> *this_01;
  long lVar9;
  int i;
  Box<float> *extraout_RDX;
  Box<float> *extraout_RDX_00;
  Box<float> *extraout_RDX_01;
  Box<float> *extraout_RDX_02;
  Box<float> *valueBox;
  long lVar10;
  Node *pNVar11;
  iterator iVar12;
  Node **value_1;
  Node **__args;
  Box<float> local_70;
  Box<float> *local_60;
  Node *local_58;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *local_50;
  vector<Node_*,_std::allocator<Node_*>_> *__range2;
  Node **ppNStack_40;
  Node **local_38;
  
  lVar10._0_4_ = (this->mBox).left;
  lVar10._4_4_ = (this->mBox).top;
  if (lVar10 == 0) {
    if (((Node *)0x7 < node) ||
       ((ulong)(*(long *)&this[1].mBox.width - *(long *)&this[1].mBox) < 0x80)) {
      iVar12._M_current = *(Node ***)&this[1].mBox.width;
      if ((Node *)iVar12._M_current ==
          this[1].mRoot._M_t.
          super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
          .
          super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
          ._M_head_impl) goto LAB_00101eba;
      (((Node *)iVar12._M_current)->children)._M_elems[0]._M_t =
           (__uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
            )*(__uniq_ptr_data<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>,_true,_true>
               *)box;
      goto LAB_00101ea6;
    }
    local_50 = this + 1;
    lVar10 = 0;
    pNVar11 = node;
    local_60 = box;
    do {
      puVar7 = (undefined8 *)operator_new(0x38);
      *puVar7 = 0;
      puVar7[1] = 0;
      puVar7[2] = 0;
      puVar7[3] = 0;
      puVar7[4] = 0;
      puVar7[5] = 0;
      puVar7[6] = 0;
      lVar9 = 0;
      do {
        *(undefined8 *)((long)puVar7 + lVar9) = 0;
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x20);
      puVar7[4] = 0;
      puVar7[5] = 0;
      puVar7[6] = 0;
      this_00 = *(default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
                  **)((long)&(this->mBox).left + lVar10);
      *(undefined8 **)((long)&(this->mBox).left + lVar10) = puVar7;
      valueBox = extraout_RDX;
      if (this_00 !=
          (default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
           *)0x0) {
        std::
        default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
        ::operator()(this_00,pNVar11);
        valueBox = extraout_RDX_00;
      }
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x20);
    ___range2 = (Box<float>)ZEXT816(0);
    local_38 = (Node **)0x0;
    ppNVar3 = *(Node ***)&this[1].mBox.width;
    local_58 = node;
    for (__args = *(Node ***)&this[1].mBox; __args != ppNVar3; __args = __args + 1) {
      pNVar4 = *__args;
      local_70.left = (pNVar4->box).left;
      local_70.top = (pNVar4->box).top;
      local_70.width = (pNVar4->box).width;
      local_70.height = (pNVar4->box).height;
      iVar6 = getQuadrant((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                           *)depth,&local_70,valueBox);
      if (iVar6 == -1) {
        this_01 = (vector<Node*,std::allocator<Node*>> *)&__range2;
        pppNVar8 = &ppNStack_40;
        iVar12._M_current = ppNStack_40;
        if (ppNStack_40 == local_38) goto LAB_00101fb9;
LAB_00101fa9:
        *iVar12._M_current = pNVar4;
        *pppNVar8 = *pppNVar8 + 1;
        valueBox = extraout_RDX_01;
      }
      else {
        lVar10 = *(long *)(&(this->mBox).left + (long)iVar6 * 2);
        iVar12._M_current = *(Node ***)(lVar10 + 0x28);
        if (iVar12._M_current != *(Node ***)(lVar10 + 0x30)) {
          pppNVar8 = (Node ***)(lVar10 + 0x28);
          goto LAB_00101fa9;
        }
        this_01 = (vector<Node*,std::allocator<Node*>> *)(lVar10 + 0x20);
LAB_00101fb9:
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  (this_01,iVar12,__args);
        valueBox = extraout_RDX_02;
      }
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::_M_move_assign
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_50,&__range2);
    box = local_60;
    pNVar11 = local_58;
    if (__range2 != (vector<Node_*,_std::allocator<Node_*>_> *)0x0) {
      operator_delete(__range2,(long)local_38 - (long)__range2);
      box = local_60;
      pNVar11 = local_58;
    }
  }
  else {
    uVar2._M_t.
    super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
    .
    super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ._M_head_impl =
         *(__uniq_ptr_data<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>,_true,_true>
           *)box;
    ___range2 = *(Box<float> *)
                 uVar2._M_t.
                 super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                 .
                 super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                 ._M_head_impl;
    uVar5 = getQuadrant((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                         *)depth,(Box<float> *)&__range2,(Box<float> *)depth);
    if (uVar5 == 0xffffffff) {
      iVar12._M_current = *(Node ***)&this[1].mBox.width;
      if ((Node *)iVar12._M_current ==
          this[1].mRoot._M_t.
          super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
          .
          super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
          ._M_head_impl) {
LAB_00101eba:
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)(this + 1),iVar12,(Node **)box);
        return;
      }
      (((Node *)iVar12._M_current)->children)._M_elems[0]._M_t =
           uVar2._M_t.
           super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
           ._M_t.
           super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
           .
           super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
           ._M_head_impl;
LAB_00101ea6:
      pfVar1 = &this[1].mBox.width;
      *(long *)pfVar1 = *(long *)pfVar1 + 8;
      return;
    }
    this = *(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
             **)(&(this->mBox).left + (ulong)uVar5 * 2);
    ___range2 = computeBox((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                            *)depth,(Box<float> *)(ulong)uVar5,i);
    depth = (size_t)&__range2;
    pNVar11 = (Node *)((long)&(node->children)._M_elems[0]._M_t.
                              super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                              .
                              super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                      + 1);
  }
  add(this,pNVar11,depth,box,value);
  return;
}

Assistant:

void add(Node* node, std::size_t depth, const Box<Float>& box, const T& value)
    {
        assert(node != nullptr);
        assert(box.contains(mGetBox(value)));
        if (isLeaf(node))
        {
            // Insert the value in this node if possible
            if (depth >= MaxDepth || node->values.size() < Threshold)
                node->values.push_back(value);
            // Otherwise, we split and we try again
            else
            {
                split(node, box);
                add(node, depth, box, value);
            }
        }
        else
        {
            auto i = getQuadrant(box, mGetBox(value));
            // Add the value in a child if the value is entirely contained in it
            if (i != -1)
                add(node->children[static_cast<std::size_t>(i)].get(), depth + 1, computeBox(box, i), value);
            // Otherwise, we add the value in the current node
            else
                node->values.push_back(value);
        }
    }